

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus
debugCompareHighsInfoStatus(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  HighsDebugStatus status0;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"primal_status",&local_61);
  HVar1 = debugCompareHighsInfoInteger
                    (&local_40,options,(highs_info0->super_HighsInfoStruct).primal_solution_status,
                     (highs_info1->super_HighsInfoStruct).primal_solution_status);
  HVar1 = debugWorseStatus(HVar1,kOk);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,"dual_status",&local_61);
  status0 = debugCompareHighsInfoInteger
                      (&local_60,options,(highs_info0->super_HighsInfoStruct).dual_solution_status,
                       (highs_info1->super_HighsInfoStruct).dual_solution_status);
  HVar1 = debugWorseStatus(status0,HVar1);
  std::__cxx11::string::~string((string *)&local_60);
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoStatus(const HighsOptions& options,
                                             const HighsInfo& highs_info0,
                                             const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("primal_status", options,
                                   highs_info0.primal_solution_status,
                                   highs_info1.primal_solution_status),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("dual_status", options,
                                   highs_info0.dual_solution_status,
                                   highs_info1.dual_solution_status),
      return_status);
  return return_status;
}